

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree-rb.c
# Opt level: O0

void pp_tree_rb_balance_insert(PTreeRBNode *node,PTreeBaseNode **root)

{
  pboolean pVar1;
  PTreeRBNode *node_00;
  PTreeRBNode *node_01;
  PTreeRBNode *gparent;
  PTreeRBNode *uncle;
  PTreeBaseNode **root_local;
  PTreeRBNode *node_local;
  
  root_local = (PTreeBaseNode **)node;
  while( true ) {
    if (root_local[4] == (PTreeBaseNode *)0x0) {
      *(undefined4 *)(root_local + 5) = 2;
      return;
    }
    pVar1 = pp_tree_rb_is_black((PTreeRBNode *)root_local[4]);
    if (pVar1 == 1) break;
    node_00 = pp_tree_rb_get_uncle((PTreeRBNode *)root_local);
    node_01 = pp_tree_rb_get_gparent((PTreeRBNode *)root_local);
    if ((node_00 == (PTreeRBNode *)0x0) || (pVar1 = pp_tree_rb_is_red(node_00), pVar1 != 1)) {
      if (root_local[4] == (node_01->base).left) {
        if ((PTreeBaseNode_ *)root_local == root_local[4]->right) {
          pp_tree_rb_rotate_left((PTreeRBNode *)root_local[4],root);
          root_local = &(*root_local)->left;
        }
        node_01->color = P_TREE_RB_COLOR_RED;
        *(undefined4 *)&root_local[4][1].right = 2;
        pp_tree_rb_rotate_right(node_01,root);
        return;
      }
      if ((PTreeBaseNode_ *)root_local == root_local[4]->left) {
        pp_tree_rb_rotate_right((PTreeRBNode *)root_local[4],root);
        root_local = &root_local[1]->left;
      }
      node_01->color = P_TREE_RB_COLOR_RED;
      *(undefined4 *)&root_local[4][1].right = 2;
      pp_tree_rb_rotate_left(node_01,root);
      return;
    }
    *(undefined4 *)&root_local[4][1].right = 2;
    node_00->color = P_TREE_RB_COLOR_BLACK;
    node_01->color = P_TREE_RB_COLOR_RED;
    root_local = (PTreeBaseNode **)node_01;
  }
  return;
}

Assistant:

static void
pp_tree_rb_balance_insert (PTreeRBNode *node, PTreeBaseNode **root)
{
	PTreeRBNode *uncle;
	PTreeRBNode *gparent;

	while (TRUE) {
		/* Case 1: We are at the root  */
		if (P_UNLIKELY (node->parent == NULL)) {
			node->color = P_TREE_RB_COLOR_BLACK;
			break;
		}

		/* Case 2: We have a black parent */
		if (pp_tree_rb_is_black (node->parent) == TRUE)
			break;

		uncle   = pp_tree_rb_get_uncle (node);
		gparent = pp_tree_rb_get_gparent (node);

		/* Case 3: Both parent and uncle are red, flip colors
		 *
		 *       G            g
		 *      / \          / \
		 *     p   u  -->   P   U
		 *    /            /
		 *   n            n
		 */
		if (uncle != NULL && pp_tree_rb_is_red (uncle) == TRUE) {
			node->parent->color = P_TREE_RB_COLOR_BLACK;
			uncle->color        = P_TREE_RB_COLOR_BLACK;
			gparent->color      = P_TREE_RB_COLOR_RED;

			/* Continue iteratively from gparent */
			node = gparent;
			continue;
		}

		if (node->parent == (PTreeRBNode *) gparent->base.left) {
			if (node == (PTreeRBNode *) node->parent->base.right) {
				/* Case 4a: Left rotate at parent
				 *
				 *      G             G
				 *     / \           / \
				 *    p   U  -->    n   U
				 *     \           /
				 *      n         p
				 */
				pp_tree_rb_rotate_left (node->parent, root);

				node = (PTreeRBNode *) node->base.left;
			}

			gparent->color      = P_TREE_RB_COLOR_RED;
			node->parent->color = P_TREE_RB_COLOR_BLACK;

			/* Case 5a: Right rotate at gparent
			 *
			 *        G           P
			 *       / \         / \
			 *      p   U  -->  n   g
			 *     /                 \
			 *    n                   U
			 */
			pp_tree_rb_rotate_right (gparent, root);

			break;
		} else {
			if (node == (PTreeRBNode *) node->parent->base.left) {
				/* Case 4b: Right rotate at parent */
				pp_tree_rb_rotate_right (node->parent, root);

				node = (PTreeRBNode *) node->base.right;
			}

			gparent->color      = P_TREE_RB_COLOR_RED;
			node->parent->color = P_TREE_RB_COLOR_BLACK;

			/* Case 5b: Left rotate at gparent*/
			pp_tree_rb_rotate_left (gparent, root);

			break;
		}
	}
}